

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  PlatformInterface *pPVar1;
  TestStatus *pTVar2;
  VkAllocationCallbacks *pVVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  Unique<vk::VkDevice_s_*> *ptr;
  Parameters *pPVar9;
  long lVar10;
  size_type __n;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  objects;
  undefined8 local_3c8;
  TestStatus *local_3c0;
  RefBase<vk::VkDevice_s_*> local_3b8;
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  Resources res;
  
  local_3c8 = param_3;
  local_3c0 = __return_storage_ptr__;
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&allocRecorder,pVVar3,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar4 = Context::getDeviceInterface(context);
  pVVar5 = Context::getDevice(context);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar9 = (Parameters *)context->m_progCollection;
  env.allocationCallbacks =
       &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar1;
  env.vkd = pDVar4;
  env.device = pVVar5;
  env.programBinaries = (BinaryCollection *)pPVar9;
  Device::Resources::Resources(&res,&env,(Parameters *)&local_3c8);
  sVar6 = getCurrentSystemMemoryUsage(&allocRecorder);
  Device::create((Move<vk::VkDevice_s_*> *)&local_3b8,&env,&res,pPVar9);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_data.deleter.m_allocator
  ;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3b8.m_data.object;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b8.m_data.deleter.m_destroyDevice;
  local_3b8.m_data.object = (VkDevice_s *)0x0;
  local_3b8.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_3b8);
  sVar7 = getCurrentSystemMemoryUsage(&allocRecorder);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase((RefBase<vk::VkDevice_s_*> *)&objects);
  Device::Resources::~Resources(&res);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&allocRecorder);
  sVar6 = getSafeObjectCount(context,sVar7 - sVar6,0);
  __n = 0x20;
  if (sVar6 < 0x20) {
    __n = sVar6;
  }
  Environment::Environment(&env,context,(deUint32)__n);
  Device::Resources::Resources(&res,&env,(Parameters *)&local_3c8);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::vector(&objects,__n,(allocator_type *)&allocRecorder);
  allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)context->m_testCtx->m_log;
  pVVar3 = &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pVVar3);
  std::operator<<((ostream *)pVVar3,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)pVVar3);
  std::operator<<((ostream *)pVVar3," ");
  pcVar8 = ::vk::getTypeName<vk::VkDevice_s*>();
  std::operator<<((ostream *)pVVar3,pcVar8);
  std::operator<<((ostream *)pVVar3," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&allocRecorder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pVVar3);
  for (lVar10 = 0; __n * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
    ptr = (Unique<vk::VkDevice_s_*> *)operator_new(0x18);
    Device::create((Move<vk::VkDevice_s_*> *)&allocRecorder,&env,&res,pPVar9);
    (ptr->super_RefBase<vk::VkDevice_s_*>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    (ptr->super_RefBase<vk::VkDevice_s_*>).m_data.object =
         (VkDevice_s *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
    (ptr->super_RefBase<vk::VkDevice_s_*>).m_data.deleter.m_destroyDevice =
         (DestroyDeviceFunc)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData =
         (void *)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation =
         (PFN_vkAllocationFunction)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *)&local_3b8,ptr);
    de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar10),
               (SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *)&local_3b8);
    de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *)&local_3b8);
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase
              ((RefBase<vk::VkDevice_s_*> *)&allocRecorder);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocRecorder,"Ok",(allocator<char> *)&local_3b8);
  pTVar2 = local_3c0;
  tcu::TestStatus::pass(local_3c0,(string *)&allocRecorder);
  std::__cxx11::string::~string((string *)&allocRecorder);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::~vector(&objects);
  Device::Resources::~Resources(&res);
  return pTVar2;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}